

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

CURLcode cf_cntrl_all(connectdata *conn,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                     void *arg2)

{
  Curl_cft_cntrl *pCVar1;
  bool bVar2;
  bool bVar3;
  CURLcode CVar4;
  long lVar5;
  Curl_cfilter *pCVar6;
  
  lVar5 = 0;
  bVar2 = true;
  do {
    pCVar6 = conn->cfilter[lVar5];
    CVar4 = CURLE_OK;
    if (pCVar6 != (Curl_cfilter *)0x0) {
      CVar4 = CURLE_OK;
      do {
        pCVar1 = pCVar6->cft->cntrl;
        if (((pCVar1 != Curl_cf_def_cntrl) &&
            (CVar4 = (*pCVar1)(pCVar6,data,event,arg1,(void *)0x0), !ignore_result)) &&
           (CVar4 != CURLE_OK)) break;
        pCVar6 = pCVar6->next;
      } while (pCVar6 != (Curl_cfilter *)0x0);
      if ((!ignore_result) && (CVar4 != CURLE_OK)) {
        return CVar4;
      }
    }
    lVar5 = 1;
    bVar3 = !bVar2;
    bVar2 = false;
    if (bVar3) {
      return CVar4;
    }
  } while( true );
}

Assistant:

static CURLcode cf_cntrl_all(struct connectdata *conn,
                             struct Curl_easy *data,
                             bool ignore_result,
                             int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  size_t i;

  for(i = 0; i < ARRAYSIZE(conn->cfilter); ++i) {
    result = Curl_conn_cf_cntrl(conn->cfilter[i], data, ignore_result,
                                event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}